

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

Int __thiscall ipx::Basis::AdaptToSingularFactorization(Basis *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Int IVar4;
  LuUpdate *this_00;
  pointer rowperm_00;
  SparseMatrix *U;
  reference piVar5;
  reference pvVar6;
  size_type sVar7;
  long in_RDI;
  Int jn;
  Int jb;
  Int i;
  Int p;
  Int k;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> dependent_cols;
  vector<int,_std::allocator<int>_> colperm;
  vector<int,_std::allocator<int>_> rowperm;
  Int n;
  Int m;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  allocator_type *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  SparseMatrix *L;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  undefined1 *local_80;
  Int local_10;
  Int local_c;
  
  local_c = Model::rows(*(Model **)(in_RDI + 8));
  local_10 = Model::cols(*(Model **)(in_RDI + 8));
  std::allocator<int>::allocator((allocator<int> *)0x80b3c2);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<int>::~allocator((allocator<int> *)0x80b3e8);
  this_00 = (LuUpdate *)(long)local_c;
  std::allocator<int>::allocator((allocator<int> *)0x80b407);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this_00,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
  std::allocator<int>::~allocator((allocator<int> *)0x80b42d);
  L = (SparseMatrix *)&stack0xffffffffffffff88;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x80b43f);
  rowperm_00 = std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::operator->
                         ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)0x80b44d
                         );
  U = (SparseMatrix *)
      std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x80b45f);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x80b471);
  LuUpdate::GetFactors
            (this_00,L,U,(Int *)rowperm_00,
             (Int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_80 = &stack0xffffffffffffff88;
  local_88._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (!bVar2) break;
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_88);
    iVar3 = *piVar5;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8,(long)iVar3);
    in_stack_ffffffffffffff14 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffd8,(long)iVar3);
    iVar3 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),
                        (long)in_stack_ffffffffffffff14);
    iVar1 = *pvVar6;
    iVar3 = local_10 + iVar3;
    in_stack_ffffffffffffff10 = iVar3;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),
                        (long)in_stack_ffffffffffffff14);
    *pvVar6 = in_stack_ffffffffffffff10;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)iVar3);
    *pvVar6 = in_stack_ffffffffffffff14;
    if (-1 < iVar1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)iVar1);
      *pvVar6 = -1;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_88);
  }
  sVar7 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff88);
  IVar4 = (Int)sVar7;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)U);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)U);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)U);
  return IVar4;
}

Assistant:

Int Basis::AdaptToSingularFactorization() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    std::vector<Int> rowperm(m), colperm(m), dependent_cols;

    lu_->GetFactors(nullptr, nullptr, rowperm.data(), colperm.data(),
                    &dependent_cols);
    for (Int k : dependent_cols) {
        // Column p of the basis matrix was replaced by the i-th unit
        // column. Insert the corresponding slack variable jn into
        // position p of the basis.
        Int p = colperm[k];
        Int i = rowperm[k];
        Int jb = basis_[p];
        Int jn = n+i;
        assert(map2basis_[jn] < 0);
        basis_[p] = jn;
        map2basis_[jn] = p; // now BASIC at position p
        if (jb >= 0)
            map2basis_[jb] = -1; // now NONBASIC
    }
    return dependent_cols.size();
}